

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O3

pair<unsigned_long,_bool> __thiscall
phmap::container_internal::
raw_hash_set<phmap::container_internal::FlatHashMapPolicy<std::__cxx11::string,int>,std::function<unsigned_long(std::__cxx11::string_const&)>,phmap::EqualTo<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>
::find_or_prepare_insert<std::__cxx11::string>
          (raw_hash_set<phmap::container_internal::FlatHashMapPolicy<std::__cxx11::string,int>,std::function<unsigned_long(std::__cxx11::string_const&)>,phmap::EqualTo<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>
           *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *key,size_t hash)

{
  ulong uVar1;
  uint uVar2;
  uint uVar3;
  undefined1 auVar4 [16];
  bool bVar5;
  uint uVar6;
  undefined8 extraout_RDX;
  undefined8 uVar8;
  ulong uVar9;
  size_t sVar10;
  long lVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [64];
  pair<unsigned_long,_bool> pVar14;
  EqualElement<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_78;
  pair<std::tuple<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>,_std::tuple<const_int_&>_>
  local_68;
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  ulong uVar7;
  
  uVar1 = *(ulong *)(this + 0x18);
  uVar9 = hash >> 7;
  lVar11 = 0;
  auVar12 = vpbroadcastb_avx512vl();
  auVar13 = ZEXT1664(auVar12);
  do {
    uVar9 = uVar9 & uVar1;
    auVar12 = *(undefined1 (*) [16])(*(long *)this + uVar9);
    uVar7 = vpcmpeqb_avx512vl(auVar13._0_16_,auVar12);
    auVar4 = auVar13._0_16_;
    if ((short)uVar7 != 0) {
      do {
        local_48 = auVar4;
        local_58 = auVar12;
        uVar2 = 0;
        uVar6 = (uint)uVar7;
        for (uVar3 = uVar6; (uVar3 & 1) == 0; uVar3 = uVar3 >> 1 | 0x80000000) {
          uVar2 = uVar2 + 1;
        }
        sVar10 = uVar2 + uVar9 & uVar1;
        local_68.first.
        super__Tuple_impl<0UL,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
        .
        super__Head_base<0UL,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_false>
        ._M_head_impl =
             (_Tuple_impl<0UL,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
              )(*(long *)(this + 8) + sVar10 * 0x28);
        local_68.second.super__Tuple_impl<0UL,_const_int_&>.
        super__Head_base<0UL,_const_int_&,_false>._M_head_impl =
             (_Tuple_impl<0UL,_const_int_&>)(*(long *)(this + 8) + 0x20 + sVar10 * 0x28);
        local_78.rhs = key;
        local_78.eq = (key_equal *)(this + 0x28);
        bVar5 = memory_internal::
                DecomposePairImpl<phmap::container_internal::raw_hash_set<phmap::container_internal::FlatHashMapPolicy<std::__cxx11::string,int>,std::function<unsigned_long(std::__cxx11::string_const&)>,phmap::EqualTo<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>::EqualElement<std::__cxx11::string>,std::__cxx11::string_const&,std::tuple<int_const&>>
                          (&local_78,&local_68);
        if (bVar5) {
          uVar8 = 0;
          goto LAB_0016cf68;
        }
        auVar13 = ZEXT1664(local_48);
        uVar6 = uVar6 - 1 & uVar6;
        uVar7 = (ulong)uVar6;
        auVar12 = local_58;
        auVar4 = local_48;
      } while (uVar6 != 0);
    }
    auVar12 = vpsignb_avx(auVar12,auVar12);
    if ((((((((((((((((auVar12 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                     (auVar12 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar12 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   (auVar12 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar12 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                 (auVar12 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar12 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
               (auVar12 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar12 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
             (auVar12 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (auVar12 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
           (auVar12 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
          (auVar12 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
         (auVar12 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
        (auVar12 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar12[0xf] < '\0')
    {
      sVar10 = raw_hash_set<phmap::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::function<unsigned_long_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
               ::prepare_insert((raw_hash_set<phmap::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::function<unsigned_long_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                                 *)this,hash);
      uVar8 = CONCAT71((int7)((ulong)extraout_RDX >> 8),1);
LAB_0016cf68:
      pVar14._8_8_ = uVar8;
      pVar14.first = sVar10;
      return pVar14;
    }
    uVar9 = lVar11 + 0x10 + uVar9;
    lVar11 = lVar11 + 0x10;
  } while( true );
}

Assistant:

std::pair<size_t, bool> find_or_prepare_insert(const K& key, size_t hash) {
        auto seq = probe(hash);
        while (true) {
            Group g{ctrl_ + seq.offset()};
            for (int i : g.Match(H2(hash))) {
                if (PHMAP_PREDICT_TRUE(PolicyTraits::apply(
                                          EqualElement<K>{key, eq_ref()},
                                          PolicyTraits::element(slots_ + seq.offset(i)))))
                    return {seq.offset(i), false};
            }
            if (PHMAP_PREDICT_TRUE(g.MatchEmpty())) break;
            seq.next();
        }
        return {prepare_insert(hash), true};
    }